

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap_secure.hpp
# Opt level: O3

Error * __thiscall
ot::commissioner::coap::CoapSecure::GetLocalAddr
          (Error *__return_storage_ptr__,CoapSecure *this,Address *aAddr)

{
  element_type *peVar1;
  pointer puVar2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  pointer local_88;
  pointer puStack_80;
  pointer local_78;
  undefined1 local_70 [24];
  string local_58;
  undefined1 local_38 [16];
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  peVar1 = (this->mSocket).
           super___shared_ptr<ot::commissioner::UdpSocket,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((peVar1->super_Socket).mIsConnected == false) {
    fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_38;
    fmt::v10::vformat_abi_cxx11_
              (&local_58,(v10 *)"socket is not connected",(string_view)ZEXT816(0x17),args);
    local_88 = (pointer)CONCAT44(local_88._4_4_,0xf);
    puStack_80 = local_70;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&puStack_80,local_58._M_dataplus._M_p,
               local_58._M_dataplus._M_p + local_58._M_string_length);
    __return_storage_ptr__->mCode = (ErrorCode)local_88;
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->mMessage,(string *)&puStack_80);
    if (puStack_80 != local_70) {
      operator_delete(puStack_80);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p == &local_58.field_2) {
      return __return_storage_ptr__;
    }
  }
  else {
    (*(peVar1->super_Socket)._vptr_Socket[3])(&local_88);
    puVar2 = (aAddr->mBytes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    (aAddr->mBytes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = local_88;
    (aAddr->mBytes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puStack_80;
    (aAddr->mBytes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = local_78;
    local_88 = (pointer)0x0;
    puStack_80 = (undefined1 *)0x0;
    local_78 = (pointer)0x0;
    if (puVar2 == (pointer)0x0) {
      return __return_storage_ptr__;
    }
    operator_delete(puVar2);
    local_58._M_dataplus._M_p = (pointer)local_88;
    if (local_88 == (pointer)0x0) {
      return __return_storage_ptr__;
    }
  }
  operator_delete(local_58._M_dataplus._M_p);
  return __return_storage_ptr__;
}

Assistant:

Error GetLocalAddr(Address &aAddr) const
    {
        Error error;

        VerifyOrExit(mSocket->IsConnected(), error = ERROR_INVALID_STATE("socket is not connected"));
        aAddr = mSocket->GetLocalAddr();

    exit:
        return error;
    }